

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O2

void __thiscall
wasm::WATParser::WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
          (WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *this)

{
  ParseImplicitTypeDefsCtx *pPVar1;
  
  pPVar1 = this->ctx;
  (pPVar1->in).pos = (ulong)this->original;
  Lexer::advance(&pPVar1->in);
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  _M_move_assign(&(this->ctx->in).annotations,&this->annotations);
  std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  ~_Vector_base(&(this->annotations).
                 super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
               );
  return;
}

Assistant:

~WithPosition() {
    ctx.in.setPos(original);
    ctx.in.setAnnotations(std::move(annotations));
  }